

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O3

double __thiscall chrono::utils::MixtureIngredient::calcMinSeparation(MixtureIngredient *this)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  lVar3 = 0xe0;
  lVar4 = 0xe8;
  lVar5 = 0xf0;
  if (this->m_sizeDist == (normal_distribution<double> *)0x0) {
    lVar3 = 0xb0;
    lVar4 = 0xb8;
    lVar5 = 0xc0;
  }
  dVar1 = *(double *)((long)&this->m_generator + lVar4);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1;
  dVar2 = *(double *)((long)&this->m_generator + lVar5);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar2;
  auVar6 = vmaxsd_avx(auVar7,auVar6);
  if (dVar2 <= dVar1) {
    lVar5 = lVar4;
  }
  if (auVar6._0_8_ <= *(double *)((long)&this->m_generator + lVar3)) {
    lVar5 = lVar3;
  }
  return *(double *)((long)&this->m_generator + lVar5);
}

Assistant:

double MixtureIngredient::calcMinSeparation() {
    if (m_sizeDist)
        return std::max(m_maxSize.x(), std::max(m_maxSize.y(), m_maxSize.z()));

    return std::max(m_defSize.x(), std::max(m_defSize.y(), m_defSize.z()));
}